

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

void reader_deinit(FileReader reader)

{
  long lVar1;
  FileBufSlot *slot;
  RK_U32 i;
  FileReaderImpl *impl;
  FileReader reader_local;
  
  if ((reader == (FileReader)0x0) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","reader_deinit",0x15f),
     (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  reader_stop(reader);
  if (*reader != 0) {
    fclose(*reader);
    *(undefined8 *)reader = 0;
  }
  for (slot._4_4_ = 0; slot._4_4_ < *(uint *)((long)reader + 0x68); slot._4_4_ = slot._4_4_ + 1) {
    lVar1 = *(long *)(*(long *)((long)reader + 0x70) + (ulong)slot._4_4_ * 8);
    if (lVar1 != 0) {
      if (*(long *)(lVar1 + 8) != 0) {
        mpp_buffer_put_with_caller(*(undefined8 *)(lVar1 + 8),"reader_deinit");
        *(undefined8 *)(lVar1 + 8) = 0;
      }
      if (*(long *)(*(long *)((long)reader + 0x70) + (ulong)slot._4_4_ * 8) != 0) {
        mpp_osal_free("reader_deinit",
                      *(undefined8 *)(*(long *)((long)reader + 0x70) + (ulong)slot._4_4_ * 8));
      }
      *(undefined8 *)(*(long *)((long)reader + 0x70) + (ulong)slot._4_4_ * 8) = 0;
    }
  }
  if (*(long *)((long)reader + 0x50) != 0) {
    mpp_buffer_group_put(*(undefined8 *)((long)reader + 0x50));
    *(undefined8 *)((long)reader + 0x50) = 0;
  }
  if (*(long *)((long)reader + 0x70) != 0) {
    mpp_osal_free("reader_deinit",*(undefined8 *)((long)reader + 0x70));
  }
  *(undefined8 *)((long)reader + 0x70) = 0;
  if (reader != (FileReader)0x0) {
    mpp_osal_free("reader_deinit",reader);
  }
  return;
}

Assistant:

void reader_deinit(FileReader reader)
{
    FileReaderImpl *impl = (FileReaderImpl*)(reader);
    RK_U32 i;

    mpp_assert(impl);
    reader_stop(impl);

    if (impl->fp_input) {
        fclose(impl->fp_input);
        impl->fp_input = NULL;
    }

    for (i = 0; i < impl->slot_cnt; i++) {
        FileBufSlot *slot = impl->slots[i];
        if (!slot)
            continue;

        if (slot->buf) {
            mpp_buffer_put(slot->buf);
            slot->buf = NULL;
        }
        MPP_FREE(impl->slots[i]);
    }

    if (impl->group) {
        mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    MPP_FREE(impl->slots);
    MPP_FREE(impl);
}